

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam0000000000149d70 = 0x2e2e2e2e2e2e2e;
    uRam0000000000149d77 = 0x2e2e2e2e2e2e2e2e;
    _DAT_00149d60 = 0x2e2e2e2e2e2e2e2e;
    uRam0000000000149d68 = 0x2e2e2e2e2e2e2e;
    DAT_00149d6f = 0x2e;
    _DAT_00149d50 = 0x2e2e2e2e2e2e2e2e;
    uRam0000000000149d58 = 0x2e2e2e2e2e2e2e2e;
    _DAT_00149d40 = 0x2e2e2e2e2e2e2e2e;
    uRam0000000000149d48 = 0x2e2e2e2e2e2e2e2e;
    _line = 0x2e2e2e2e2e2e2e2e;
    uRam0000000000149d38 = 0x2e2e2e2e2e2e2e2e;
    DAT_00149d7f = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void printClosedHeader( std::string const& _name ) {
            printOpenHeader( _name );
            stream << getLineOfChars<'.'>() << "\n";
        }